

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeConvert_value.c
# Opt level: O2

void truncSat_op(vm *v,instruction *inst)

{
  ulong uVar1;
  int32 val;
  uint32 val_00;
  ulong uVar2;
  int64 val_01;
  float32 fVar3;
  float fVar4;
  float64 fVar5;
  double dVar6;
  
  switch(*inst->arg) {
  case 0:
    fVar3 = popF32(&v->operandStack);
    fVar4 = truncf((float)fVar3);
    val = (int32)fVar4;
    break;
  case 1:
    fVar3 = popF32(&v->operandStack);
    fVar4 = truncf((float)fVar3);
    val_00 = (uint32)(long)fVar4;
    goto LAB_0010663f;
  case 2:
    fVar5 = popF64(&v->operandStack);
    dVar6 = trunc((double)fVar5);
    val = (int32)dVar6;
    break;
  case 3:
    fVar5 = popF64(&v->operandStack);
    dVar6 = trunc((double)fVar5);
    val_00 = (uint32)(long)dVar6;
LAB_0010663f:
    pushU32(&v->operandStack,val_00);
    return;
  case 4:
    fVar3 = popF32(&v->operandStack);
    fVar4 = truncf((float)fVar3);
    val_01 = (int64)fVar4;
    goto LAB_0010668f;
  case 5:
    fVar3 = popF32(&v->operandStack);
    fVar4 = truncf((float)fVar3);
    uVar1 = (ulong)fVar4;
    uVar2 = (ulong)(fVar4 - 9.223372e+18);
    goto LAB_0010666e;
  case 6:
    fVar5 = popF64(&v->operandStack);
    dVar6 = trunc((double)fVar5);
    val_01 = (int64)dVar6;
LAB_0010668f:
    pushS64(&v->operandStack,val_01);
    return;
  case 7:
    fVar5 = popF64(&v->operandStack);
    dVar6 = trunc((double)fVar5);
    uVar1 = (ulong)dVar6;
    uVar2 = (ulong)(dVar6 - 9.223372036854776e+18);
LAB_0010666e:
    pushU64(&v->operandStack,uVar2 & (long)uVar1 >> 0x3f | uVar1);
    return;
  default:
    return;
  }
  pushS32(&v->operandStack,val);
  return;
}

Assistant:

void truncSat_op(vm *v, instruction *inst) {
    stack *s = &v->operandStack;
    byte op = *(byte *) (inst->arg);
    switch (op) {
        case 0x00:
            pushS32(s, (int32) (trunc((float64) popF32(s))));
            break;
        case 0x01:
            pushU32(s, (uint32) (trunc((float64) popF32(s))));
            break;
        case 0x02:
            pushS32(s, (int32) (trunc(popF64(s))));
            break;
        case 0x03:
            pushU32(s, (uint32) (trunc(popF64(s))));
            break;
        case 0x04:
            pushS64(s, (int64) (trunc((float64) popF32(s))));
            break;
        case 0x05:
            pushU64(s, (uint64) (trunc((float64) popF32(s))));
            break;
        case 0x06:
            pushS64(s, (int64) (trunc(popF64(s))));
            break;
        case 0x07:
            pushU64(s, (uint64) (trunc(popF64(s))));
            break;
        default:
            break;
    }
}